

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ptr<Statement> __thiscall Parser::continueStatement(Parser *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Parser *in_RSI;
  char *this_00;
  char *this_01;
  ptr<Statement> pVar4;
  ptr<Statement> pVar5;
  ptr<Statement> pVar6;
  undefined1 uStack_69;
  shared_ptr<Expression> sStack_68;
  _Alloc_hider _Stack_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  
  if (in_RSI->functionCounter != 0) {
    consume(in_RSI);
    consume(in_RSI,StatEnd,"\';\'");
    puVar2 = (undefined8 *)operator_new(0x18);
    puVar2[1] = 0x100000001;
    *puVar2 = &PTR___Sp_counted_ptr_inplace_0012ee88;
    puVar2[2] = &PTR_execute_0012eed8;
    (this->filepath)._M_dataplus._M_p = (pointer)(puVar2 + 2);
    (this->filepath)._M_string_length = (size_type)puVar2;
    pVar4.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_execute_0012eed8;
    pVar4.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (ptr<Statement>)pVar4.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = "Unexpected \'continue\' outside a function.";
  error(in_RSI,"Unexpected \'continue\' outside a function.");
  if (((Parser *)this_00)->functionCounter == 0) {
    this_01 = "Unexpected \'continue\' outside a function.";
    error((Parser *)this_00,"Unexpected \'continue\' outside a function.");
    consume((Parser *)this_01);
    sStack_68.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    sStack_68.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar1 = match((Parser *)this_01,StatEnd);
    if (!bVar1) {
      expression((Parser *)&stack0xffffffffffffffa8);
      sStack_68.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Stack_58._M_p;
      sStack_68.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_50._M_pi;
    }
    consume((Parser *)this_01,StatEnd,"\';\'");
    _Stack_58._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<ThrowStatement,std::allocator<ThrowStatement>,std::shared_ptr<Expression>&>
              (&stack0xffffffffffffffb0,(ThrowStatement **)&stack0xffffffffffffffa8,
               (allocator<ThrowStatement> *)&uStack_69,&sStack_68);
    (((Parser *)this_00)->filepath)._M_dataplus._M_p = _Stack_58._M_p;
    (((Parser *)this_00)->filepath)._M_string_length = (size_type)_Stack_50._M_pi;
    _Var3._M_pi = extraout_RDX;
    if (sStack_68.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (sStack_68.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      _Var3._M_pi = extraout_RDX_00;
    }
    pVar6.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
    pVar6.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this_00
    ;
    return (ptr<Statement>)pVar6.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
  }
  consume((Parser *)this_00);
  consume((Parser *)this_00,StatEnd,"\';\'");
  puVar2 = (undefined8 *)operator_new(0x18);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_0012ef18;
  puVar2[2] = &PTR_execute_0012ef68;
  (in_RSI->filepath)._M_dataplus._M_p = (pointer)(puVar2 + 2);
  (in_RSI->filepath)._M_string_length = (size_type)puVar2;
  pVar5.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_execute_0012ef68;
  pVar5.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RSI;
  return (ptr<Statement>)pVar5.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::continueStatement() {
    if(functionCounter == 0)
        error("Unexpected 'continue' outside a function.");

    consume();
    consume(TokenType::StatEnd, "';'");
    return make<ContinueStatement>();
}